

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PCacheBufferSetup(void *pBuf,int sz,int n)

{
  int local_24;
  PgFreeslot *p;
  int n_local;
  int sz_local;
  void *pBuf_local;
  
  if (pcache1_g.isInit != 0) {
    p._0_4_ = n;
    p._4_4_ = sz;
    if (pBuf == (void *)0x0) {
      p._0_4_ = 0;
      p._4_4_ = 0;
    }
    if ((int)p == 0) {
      p._4_4_ = 0;
    }
    pcache1_g.nFreeSlot = (int)p;
    pcache1_g.nSlot = (int)p;
    if ((int)p < 0x5b) {
      local_24 = (int)p / 10 + 1;
    }
    else {
      local_24 = 10;
    }
    pcache1_g.nReserve = local_24;
    pcache1_g.pFree = (PgFreeslot *)0x0;
    pcache1_g.bUnderPressure = 0;
    pcache1_g.szSlot = p._4_4_ & 0xfffffff8;
    pcache1_g.pStart = pBuf;
    _n_local = (PgFreeslot *)pBuf;
    while ((int)p != 0) {
      _n_local->pNext = pcache1_g.pFree;
      pcache1_g.pFree = _n_local;
      _n_local = (PgFreeslot *)((long)&_n_local->pNext + (long)(int)(p._4_4_ & 0xfffffff8));
      p._0_4_ = (int)p + -1;
    }
    pcache1_g.pEnd = _n_local;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PCacheBufferSetup(void *pBuf, int sz, int n){
  if( pcache1.isInit ){
    PgFreeslot *p;
    if( pBuf==0 ) sz = n = 0;
    if( n==0 ) sz = 0;
    sz = ROUNDDOWN8(sz);
    pcache1.szSlot = sz;
    pcache1.nSlot = pcache1.nFreeSlot = n;
    pcache1.nReserve = n>90 ? 10 : (n/10 + 1);
    pcache1.pStart = pBuf;
    pcache1.pFree = 0;
    pcache1.bUnderPressure = 0;
    while( n-- ){
      p = (PgFreeslot*)pBuf;
      p->pNext = pcache1.pFree;
      pcache1.pFree = p;
      pBuf = (void*)&((char*)pBuf)[sz];
    }
    pcache1.pEnd = pBuf;
  }
}